

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O3

void __thiscall CaDiCaL::Proof::delete_clause(Proof *this,Clause *c)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  pointer piVar4;
  iterator __position;
  uint uVar5;
  int iVar6;
  undefined8 in_RAX;
  long lVar7;
  Clause *__range1;
  undefined8 uStack_38;
  
  piVar4 = (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  iVar1 = c->size;
  uStack_38 = in_RAX;
  if ((long)iVar1 != 0) {
    lVar7 = 0;
    do {
      uVar2 = *(uint *)((long)&c[1].field_0 + lVar7);
      uVar5 = -uVar2;
      if (0 < (int)uVar2) {
        uVar5 = uVar2;
      }
      iVar3 = (this->internal->i2e).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      iVar6 = -iVar3;
      if (-1 < (int)uVar2) {
        iVar6 = iVar3;
      }
      uStack_38 = CONCAT44(iVar6,(undefined4)uStack_38);
      __position._M_current =
           (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->clause,__position,
                   (int *)((long)&uStack_38 + 4));
      }
      else {
        *__position._M_current = iVar6;
        (this->clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = __position._M_current + 1;
      }
      lVar7 = lVar7 + 4;
    } while ((long)iVar1 * 4 != lVar7);
  }
  this->clause_id = (uint64_t)c->field_0;
  this->redundant = (bool)((byte)(*(uint *)&c->field_0x8 >> 0xb) & 1);
  delete_clause(this);
  return;
}

Assistant:

void Proof::delete_clause (Clause *c) {
  LOG (c, "PROOF deleting from proof");
  clause.clear (); // Can be non-empty if an allocation fails during adding.
  add_literals (c);
  clause_id = c->id;
  redundant = c->redundant;
  delete_clause (); // Increments 'statistics.deleted'.
}